

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordQueryReliablePdu.cpp
# Opt level: O2

int __thiscall DIS::RecordQueryReliablePdu::getMarshalledSize(RecordQueryReliablePdu *this)

{
  pointer pFVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  FourByteChunk listElement;
  
  iVar2 = SimulationManagementWithReliabilityFamilyPdu::getMarshalledSize
                    (&this->super_SimulationManagementWithReliabilityFamilyPdu);
  iVar2 = iVar2 + 0x12;
  lVar5 = 8;
  for (uVar4 = 0;
      pFVar1 = (this->_recordIDs).
               super__Vector_base<DIS::FourByteChunk,_std::allocator<DIS::FourByteChunk>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(this->_recordIDs).
                            super__Vector_base<DIS::FourByteChunk,_std::allocator<DIS::FourByteChunk>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar1 >> 4);
      uVar4 = uVar4 + 1) {
    listElement._vptr_FourByteChunk = (_func_int **)&PTR__FourByteChunk_001b10f0;
    listElement._otherParameters = *(char (*) [4])(pFVar1->_otherParameters + lVar5 + -8);
    iVar3 = FourByteChunk::getMarshalledSize(&listElement);
    iVar2 = iVar2 + iVar3;
    FourByteChunk::~FourByteChunk(&listElement);
    lVar5 = lVar5 + 0x10;
  }
  return iVar2;
}

Assistant:

int RecordQueryReliablePdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = SimulationManagementWithReliabilityFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + 4;  // _requestID
   marshalSize = marshalSize + 1;  // _requiredReliabilityService
   marshalSize = marshalSize + 2;  // _pad1
   marshalSize = marshalSize + 1;  // _pad2
   marshalSize = marshalSize + 2;  // _eventType
   marshalSize = marshalSize + 4;  // _time
   marshalSize = marshalSize + 4;  // _numberOfRecords

   for(unsigned long long idx=0; idx < _recordIDs.size(); idx++)
   {
        FourByteChunk listElement = _recordIDs[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}